

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void destroy_stream(quicly_stream_t *stream,int err)

{
  uint8_t *puVar1;
  anon_struct_32_2_6d702f80_for_pending_link *paVar2;
  quicly_linklist_t *pqVar3;
  khint_t kVar4;
  quicly_conn_t *conn;
  _func_void_void_ptr_char_ptr_varargs *p_Var5;
  kh_quicly_stream_t_t *pkVar6;
  khint64_t stream_id;
  st_quicly_linklist_t *psVar7;
  uint uVar8;
  st_quicly_conn_streamgroup_state_t *psVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  
  conn = stream->conn;
  p_Var5 = (conn->super).tracer.cb;
  if (p_Var5 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
    (*p_Var5)((conn->super).tracer.ctx,
              "{\"type\":\"stream-on-destroy\", \"time\":%lld, \"stream-id\":%d, \"err\":%lld}\n",
              (conn->stash).now,(ulong)(uint)stream->stream_id,(long)err);
  }
  if (stream->callbacks != (quicly_stream_callbacks_t *)0x0) {
    (*stream->callbacks->on_destroy)(stream,err);
  }
  pkVar6 = conn->streams;
  stream_id = stream->stream_id;
  kVar4 = pkVar6->n_buckets;
  if (kVar4 == 0) {
    uVar13 = 0;
  }
  else {
    uVar11 = ((uint)(stream_id >> 0x21) ^ (uint)stream_id << 0xb ^ (uint)stream_id) & kVar4 - 1;
    iVar12 = 1;
    uVar8 = uVar11;
    do {
      bVar10 = (char)uVar8 * '\x02' & 0x1e;
      uVar13 = pkVar6->flags[uVar8 >> 4] >> bVar10;
      if (((uVar13 & 2) != 0) || (((uVar13 & 1) == 0 && (pkVar6->keys[uVar8] == stream_id)))) {
        uVar13 = uVar8;
        if ((pkVar6->flags[uVar8 >> 4] >> bVar10 & 3) != 0) {
          uVar13 = kVar4;
        }
        break;
      }
      uVar8 = uVar8 + iVar12 & kVar4 - 1;
      iVar12 = iVar12 + 1;
      uVar13 = kVar4;
    } while (uVar8 != uVar11);
  }
  if (uVar13 == kVar4) {
    __assert_fail("iter != kh_end(conn->streams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x462,"void destroy_stream(quicly_stream_t *, int)");
  }
  uVar8 = pkVar6->flags[uVar13 >> 4];
  uVar11 = uVar13 * 2 & 0x1e;
  if ((uVar8 >> (sbyte)uVar11 & 3) == 0) {
    pkVar6->flags[uVar13 >> 4] = uVar8 | 1 << uVar11;
    pkVar6->size = pkVar6->size - 1;
  }
  if ((long)stream_id < 0) {
    puVar1 = &(stream->conn->egress).pending_flows;
    *puVar1 = *puVar1 & ~(byte)(1 << (~(byte)stream_id & 0x1f));
  }
  else {
    psVar9 = get_streamgroup_state(conn,stream_id);
    psVar9->num_streams = psVar9->num_streams - 1;
  }
  quicly_sendstate_dispose(&stream->sendstate);
  quicly_recvstate_dispose(&stream->recvstate);
  paVar2 = &(stream->_send_aux).pending_link;
  psVar7 = (stream->_send_aux).pending_link.control.prev;
  psVar7->next = (stream->_send_aux).pending_link.control.next;
  ((stream->_send_aux).pending_link.control.next)->prev = psVar7;
  (stream->_send_aux).pending_link.control.next = &paVar2->control;
  (stream->_send_aux).pending_link.control.prev = &paVar2->control;
  pqVar3 = &(stream->_send_aux).pending_link.default_scheduler;
  psVar7 = (stream->_send_aux).pending_link.default_scheduler.prev;
  psVar7->next = (stream->_send_aux).pending_link.default_scheduler.next;
  ((stream->_send_aux).pending_link.default_scheduler.next)->prev = psVar7;
  (stream->_send_aux).pending_link.default_scheduler.next = pqVar3;
  (stream->_send_aux).pending_link.default_scheduler.prev = pqVar3;
  if (conn->application != (st_quicly_application_space_t *)0x0) {
    uVar13 = 0;
    if (-1 < stream->stream_id) {
      uVar13 = (uint)((ulong)stream->stream_id >> 1) & 1;
    }
    iVar12 = should_send_max_streams(conn,uVar13);
    if (iVar12 != 0) {
      (conn->egress).send_ack_at = 0;
    }
  }
  free(stream);
  return;
}

Assistant:

static void destroy_stream(quicly_stream_t *stream, int err)
{
    quicly_conn_t *conn = stream->conn;

    QUICLY_PROBE(STREAM_ON_DESTROY, conn, conn->stash.now, stream, err);

    if (stream->callbacks != NULL)
        stream->callbacks->on_destroy(stream, err);

    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream->stream_id);
    assert(iter != kh_end(conn->streams));
    kh_del(quicly_stream_t, conn->streams, iter);

    if (stream->stream_id < 0) {
        size_t epoch = -(1 + stream->stream_id);
        stream->conn->egress.pending_flows &= ~(uint8_t)(1 << epoch);
    } else {
        struct st_quicly_conn_streamgroup_state_t *group = get_streamgroup_state(conn, stream->stream_id);
        --group->num_streams;
    }

    dispose_stream_properties(stream);

    if (conn->application != NULL) {
        /* The function is normally invoked when receiving a packet, therefore just setting send_ack_at to zero is sufficient to
         * trigger the emission of the MAX_STREAMS frame. FWIW, the only case the function is invoked when not receiving a packet is
         * when the connection is being closed. In such case, the change will not have any bad side effects.
         */
        if (should_send_max_streams(conn, quicly_stream_is_unidirectional(stream->stream_id)))
            conn->egress.send_ack_at = 0;
    }

    free(stream);
}